

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolver_test.c
# Opt level: O0

void test_google_dns(void)

{
  uint16_t uVar1;
  nng_err nVar2;
  int iVar3;
  char *pcVar4;
  nng_err result__1;
  nng_err result_;
  nni_resolv_item item;
  nng_sockaddr sa;
  nng_aio *aio;
  
  memset(&result__1,0,0x20);
  item._0_8_ = anon_var_dwarf_397;
  item.ri_host._0_2_ = 0x50;
  result_._0_1_ = NNG_EINTR;
  item._16_8_ = &item.ri_sa;
  result__1 = NNG_EINVAL;
  nVar2 = nng_aio_alloc((nng_aio **)(sa.s_storage.sa_pad + 0xf),(_func_void_void_ptr *)0x0,
                        (void *)0x0);
  pcVar4 = nng_strerror(nVar2);
  iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/resolver_test.c"
                         ,0x33,"%s: expected success, got %s (%d)","nng_aio_alloc(&aio, NULL, NULL)"
                         ,pcVar4,nVar2);
  if (iVar3 == 0) {
    acutest_abort_();
  }
  nni_resolv((nni_resolv_item *)&result__1,(nni_aio *)sa.s_storage.sa_pad[0xf]);
  nng_aio_wait((nng_aio *)sa.s_storage.sa_pad[0xf]);
  nVar2 = nng_aio_result((nng_aio *)sa.s_storage.sa_pad[0xf]);
  pcVar4 = nng_strerror(nVar2);
  iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/resolver_test.c"
                         ,0x36,"%s: expected success, got %s (%d)","nng_aio_result(aio)",pcVar4,
                         nVar2);
  if (iVar3 == 0) {
    acutest_abort_();
  }
  acutest_check_((uint)((short)item.ri_sa == 3),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/resolver_test.c"
                 ,0x37,"%s","sa.s_in.sa_family == NNG_AF_INET");
  uVar1 = nuts_be16(0x50);
  acutest_check_((uint)(item.ri_sa._2_2_ == uVar1),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/resolver_test.c"
                 ,0x38,"%s","sa.s_in.sa_port == nuts_be16(80)");
  acutest_check_((uint)(item.ri_sa._4_4_ == 0x8080808),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/resolver_test.c"
                 ,0x39,"%s","sa.s_in.sa_addr == 0x08080808");
  nng_aio_free((nng_aio *)sa.s_storage.sa_pad[0xf]);
  return;
}

Assistant:

void
test_google_dns(void)
{
	nng_aio        *aio;
	nng_sockaddr    sa;
	nni_resolv_item item = { 0 };

	item.ri_host    = "google-public-dns-a.google.com";
	item.ri_port    = 80;
	item.ri_passive = true;
	item.ri_sa      = &sa;
	item.ri_family  = NNG_AF_INET;

	NUTS_PASS(nng_aio_alloc(&aio, NULL, NULL));
	nni_resolv(&item, aio);
	nng_aio_wait(aio);
	NUTS_PASS(nng_aio_result(aio));
	NUTS_TRUE(sa.s_in.sa_family == NNG_AF_INET);
	NUTS_TRUE(sa.s_in.sa_port == nuts_be16(80));
	NUTS_TRUE(sa.s_in.sa_addr == 0x08080808); // aka 8.8.8.8
	nng_aio_free(aio);
}